

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_shiftd_rm_T1(DisasContext *s,MemOp ot,int op1,_Bool is_right,TCGv_i64 count_in)

{
  TCGContext *tcg_ctx_00;
  TCGArg TVar1;
  TCGContext *s_00;
  uintptr_t o_5;
  TCGTemp *pTVar2;
  TCGv_i64 pTVar3;
  TCGv_i64 pTVar4;
  TCGContext *tcg_ctx;
  uintptr_t o;
  TCGv_i64 pTVar5;
  TCGOpcode TVar6;
  ulong arg2;
  
  pTVar5 = s->T0;
  tcg_ctx_00 = s->uc->tcg_ctx;
  arg2 = (ulong)(ot == MO_64) << 5 | 0x1f;
  if (op1 == 0x10) {
    pTVar4 = s->A0;
    if (s->uc->hook[10].head != (list_item *)0x0) {
      TVar1 = s->prev_pc;
      pTVar2 = tcg_temp_new_internal_x86_64(tcg_ctx_00,TCG_TYPE_I64,false);
      tcg_gen_op2_x86_64(tcg_ctx_00,INDEX_op_movi_i64,(TCGArg)pTVar2,TVar1);
      tcg_gen_op3_x86_64(tcg_ctx_00,INDEX_op_st_i64,(TCGArg)pTVar2,
                         (TCGArg)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00),0x80);
      tcg_temp_free_internal_x86_64(tcg_ctx_00,pTVar2);
    }
    tcg_gen_qemu_ld_i64_x86_64(tcg_ctx_00,pTVar5,pTVar4,(long)s->mem_index,ot);
  }
  else if ((op1 - 8U < 0xfffffffc || ot != MO_8) || (s->x86_64_hregs != false)) {
    if (tcg_ctx_00->cpu_regs[op1] != pTVar5) {
      tcg_gen_op2_x86_64(tcg_ctx_00,INDEX_op_mov_i64,(TCGArg)(pTVar5 + (long)tcg_ctx_00),
                         (TCGArg)(tcg_ctx_00->cpu_regs[op1] + (long)tcg_ctx_00));
    }
  }
  else {
    tcg_gen_extract_i64_x86_64(tcg_ctx_00,pTVar5,tcg_ctx_00->cpu_regs[op1 - 4],8,8);
  }
  pTVar2 = tcg_temp_new_internal_x86_64(tcg_ctx_00,TCG_TYPE_I64,false);
  pTVar5 = (TCGv_i64)((long)pTVar2 - (long)tcg_ctx_00);
  tcg_gen_andi_i64_x86_64(tcg_ctx_00,pTVar5,count_in,arg2);
  if (ot == MO_32) {
    tcg_gen_subi_i64_x86_64(tcg_ctx_00,s->tmp0,pTVar5,1);
    if (!is_right) {
LAB_0052dd0f:
      tcg_gen_deposit_i64_x86_64(tcg_ctx_00,s->T0,s->T1,s->T0,0x20,0x20);
      tcg_gen_op3_x86_64(tcg_ctx_00,INDEX_op_shl_i64,(TCGArg)(s->tmp0 + (long)tcg_ctx_00),
                         (TCGArg)(s->T0 + (long)tcg_ctx_00),(TCGArg)(s->tmp0 + (long)tcg_ctx_00));
      tcg_gen_op3_x86_64(tcg_ctx_00,INDEX_op_shl_i64,(TCGArg)(s->T0 + (long)tcg_ctx_00),
                         (TCGArg)(s->T0 + (long)tcg_ctx_00),(TCGArg)pTVar2);
      tcg_gen_shri_i64_x86_64(tcg_ctx_00,s->tmp0,s->tmp0,0x20);
      tcg_gen_shri_i64_x86_64(tcg_ctx_00,s->T0,s->T0,0x20);
      goto LAB_0052dda5;
    }
LAB_0052db5f:
    tcg_gen_deposit_i64_x86_64(tcg_ctx_00,s->T0,s->T0,s->T1,0x20,0x20);
    tcg_gen_op3_x86_64(tcg_ctx_00,INDEX_op_shr_i64,(TCGArg)(s->tmp0 + (long)tcg_ctx_00),
                       (TCGArg)(s->T0 + (long)tcg_ctx_00),(TCGArg)(s->tmp0 + (long)tcg_ctx_00));
    pTVar4 = s->T0;
    TVar6 = INDEX_op_shr_i64;
  }
  else {
    if (ot == MO_16) {
      if (!is_right) {
        tcg_gen_deposit_i64_x86_64(tcg_ctx_00,s->T1,s->T0,s->T1,0x10,0x10);
        tcg_gen_subi_i64_x86_64(tcg_ctx_00,s->tmp0,pTVar5,1);
        goto LAB_0052dd0f;
      }
      tcg_gen_deposit_i64_x86_64(tcg_ctx_00,s->tmp0,s->T0,s->T1,0x10,0x10);
      pTVar4 = s->T1;
      if (pTVar4 != s->T0) {
        tcg_gen_op2_x86_64(tcg_ctx_00,INDEX_op_mov_i64,(TCGArg)(pTVar4 + (long)tcg_ctx_00),
                           (TCGArg)(s->T0 + (long)tcg_ctx_00));
        pTVar4 = s->T0;
      }
      pTVar3 = s->tmp0;
      if (pTVar4 != pTVar3) {
        tcg_gen_op2_x86_64(tcg_ctx_00,INDEX_op_mov_i64,(TCGArg)(pTVar4 + (long)tcg_ctx_00),
                           (TCGArg)(pTVar3 + (long)tcg_ctx_00));
        pTVar3 = s->tmp0;
      }
      tcg_gen_subi_i64_x86_64(tcg_ctx_00,pTVar3,pTVar5,1);
      goto LAB_0052db5f;
    }
    tcg_gen_subi_i64_x86_64(tcg_ctx_00,s->tmp0,pTVar5,1);
    TVar6 = is_right + INDEX_op_shl_i64;
    tcg_gen_op3_x86_64(tcg_ctx_00,TVar6,(TCGArg)(s->tmp0 + (long)tcg_ctx_00),
                       (TCGArg)(s->T0 + (long)tcg_ctx_00),(TCGArg)(s->tmp0 + (long)tcg_ctx_00));
    tcg_gen_subfi_i64_x86_64(tcg_ctx_00,s->tmp4,arg2 + 1,pTVar5);
    tcg_gen_op3_x86_64(tcg_ctx_00,TVar6,(TCGArg)(s->T0 + (long)tcg_ctx_00),
                       (TCGArg)(s->T0 + (long)tcg_ctx_00),(TCGArg)pTVar2);
    tcg_gen_op3_x86_64(tcg_ctx_00,is_right ^ INDEX_op_shr_i64,(TCGArg)(s->T1 + (long)tcg_ctx_00),
                       (TCGArg)(s->T1 + (long)tcg_ctx_00),(TCGArg)(s->tmp4 + (long)tcg_ctx_00));
    tcg_gen_op2_x86_64(tcg_ctx_00,INDEX_op_movi_i64,(TCGArg)(s->tmp4 + (long)tcg_ctx_00),0);
    tcg_gen_movcond_i64_x86_64(tcg_ctx_00,TCG_COND_EQ,s->T1,pTVar5,s->tmp4,s->tmp4,s->T1);
    pTVar4 = s->T0;
    pTVar2 = (TCGTemp *)(s->T1 + (long)tcg_ctx_00);
    TVar6 = INDEX_op_or_i64;
  }
  tcg_gen_op3_x86_64(tcg_ctx_00,TVar6,(TCGArg)(pTVar4 + (long)tcg_ctx_00),
                     (TCGArg)(pTVar4 + (long)tcg_ctx_00),(TCGArg)pTVar2);
LAB_0052dda5:
  pTVar4 = s->T0;
  if (op1 == 0x10) {
    pTVar3 = s->A0;
    s_00 = s->uc->tcg_ctx;
    if (s->uc->hook[0xb].head != (list_item *)0x0) {
      TVar1 = s->prev_pc;
      pTVar2 = tcg_temp_new_internal_x86_64(s_00,TCG_TYPE_I64,false);
      tcg_gen_op2_x86_64(s_00,INDEX_op_movi_i64,(TCGArg)pTVar2,TVar1);
      tcg_gen_op3_x86_64(s_00,INDEX_op_st_i64,(TCGArg)pTVar2,(TCGArg)(s_00->cpu_env + (long)s_00),
                         0x80);
      tcg_temp_free_internal_x86_64(s_00,pTVar2);
    }
    tcg_gen_qemu_st_i64_x86_64(s_00,pTVar4,pTVar3,(long)s->mem_index,ot);
  }
  else {
    gen_op_mov_reg_v(s,ot,op1,pTVar4);
  }
  gen_shift_flags(s,ot,s->T0,s->tmp0,pTVar5,is_right);
  tcg_temp_free_internal_x86_64(tcg_ctx_00,(TCGTemp *)(pTVar5 + (long)tcg_ctx_00));
  return;
}

Assistant:

static void gen_shiftd_rm_T1(DisasContext *s, MemOp ot, int op1,
                             bool is_right, TCGv count_in)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    target_ulong mask = (ot == MO_64 ? 63 : 31);
    TCGv count;

    /* load */
    if (op1 == OR_TMP0) {
        gen_op_ld_v(s, ot, s->T0, s->A0);
    } else {
        gen_op_mov_v_reg(s, ot, s->T0, op1);
    }

    count = tcg_temp_new(tcg_ctx);
    tcg_gen_andi_tl(tcg_ctx, count, count_in, mask);

    switch (ot) {
    case MO_16:
        /* Note: we implement the Intel behaviour for shift count > 16.
           This means "shrdw C, B, A" shifts A:B:A >> C.  Build the B:A
           portion by constructing it as a 32-bit value.  */
        if (is_right) {
            tcg_gen_deposit_tl(tcg_ctx, s->tmp0, s->T0, s->T1, 16, 16);
            tcg_gen_mov_tl(tcg_ctx, s->T1, s->T0);
            tcg_gen_mov_tl(tcg_ctx, s->T0, s->tmp0);
        } else {
            tcg_gen_deposit_tl(tcg_ctx, s->T1, s->T0, s->T1, 16, 16);
        }
        /* FALLTHRU */
#ifdef TARGET_X86_64
    case MO_32:
        /* Concatenate the two 32-bit values and use a 64-bit shift.  */
        tcg_gen_subi_tl(tcg_ctx, s->tmp0, count, 1);
        if (is_right) {
            tcg_gen_concat_tl_i64(tcg_ctx, s->T0, s->T0, s->T1);
            tcg_gen_shr_i64(tcg_ctx, s->tmp0, s->T0, s->tmp0);
            tcg_gen_shr_i64(tcg_ctx, s->T0, s->T0, count);
        } else {
            tcg_gen_concat_tl_i64(tcg_ctx, s->T0, s->T1, s->T0);
            tcg_gen_shl_i64(tcg_ctx, s->tmp0, s->T0, s->tmp0);
            tcg_gen_shl_i64(tcg_ctx, s->T0, s->T0, count);
            tcg_gen_shri_i64(tcg_ctx, s->tmp0, s->tmp0, 32);
            tcg_gen_shri_i64(tcg_ctx, s->T0, s->T0, 32);
        }
        break;
#endif
    default:
        tcg_gen_subi_tl(tcg_ctx, s->tmp0, count, 1);
        if (is_right) {
            tcg_gen_shr_tl(tcg_ctx, s->tmp0, s->T0, s->tmp0);

            tcg_gen_subfi_tl(tcg_ctx, s->tmp4, mask + 1, count);
            tcg_gen_shr_tl(tcg_ctx, s->T0, s->T0, count);
            tcg_gen_shl_tl(tcg_ctx, s->T1, s->T1, s->tmp4);
        } else {
            tcg_gen_shl_tl(tcg_ctx, s->tmp0, s->T0, s->tmp0);
            if (ot == MO_16) {
                /* Only needed if count > 16, for Intel behaviour.  */
                tcg_gen_subfi_tl(tcg_ctx, s->tmp4, 33, count);
                tcg_gen_shr_tl(tcg_ctx, s->tmp4, s->T1, s->tmp4);
                tcg_gen_or_tl(tcg_ctx, s->tmp0, s->tmp0, s->tmp4);
            }

            tcg_gen_subfi_tl(tcg_ctx, s->tmp4, mask + 1, count);
            tcg_gen_shl_tl(tcg_ctx, s->T0, s->T0, count);
            tcg_gen_shr_tl(tcg_ctx, s->T1, s->T1, s->tmp4);
        }
        tcg_gen_movi_tl(tcg_ctx, s->tmp4, 0);
        tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, s->T1, count, s->tmp4,
                           s->tmp4, s->T1);
        tcg_gen_or_tl(tcg_ctx, s->T0, s->T0, s->T1);
        break;
    }

    /* store */
    gen_op_st_rm_T0_A0(s, ot, op1);

    gen_shift_flags(s, ot, s->T0, s->tmp0, count, is_right);
    tcg_temp_free(tcg_ctx, count);
}